

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O1

float Map_CutRefDeref(Map_Cut_t *pCut,int fPhase,int fReference,int fUpdateProf)

{
  int *piVar1;
  Mio_Gate_t *pGate;
  Map_Node_t *pMVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  Map_Cut_t *pCut_00;
  long lVar6;
  float fVar7;
  float local_34;
  
  local_34 = 0.0;
  if (pCut->nLeaves != '\x01') {
    local_34 = Map_CutGetRootArea(pCut,fPhase);
    if (fUpdateProf != 0) {
      pGate = (pCut->M[fPhase].pSuperBest)->pRoot;
      if (fReference == 0) {
        Mio_GateDecProfile2(pGate);
      }
      else {
        Mio_GateIncProfile2(pGate);
      }
    }
    if ('\0' < pCut->nLeaves) {
      lVar6 = 0;
      do {
        pMVar2 = pCut->ppLeaves[lVar6];
        iVar3 = Map_CutGetLeafPhase(pCut,fPhase,(int)lVar6);
        uVar5 = (ulong)iVar3;
        if (fReference == 0) {
          if ((pMVar2->pCutBest[0] == (Map_Cut_t *)0x0) || (pMVar2->pCutBest[1] == (Map_Cut_t *)0x0)
             ) {
            piVar1 = pMVar2->nRefAct + uVar5;
            *piVar1 = *piVar1 + -1;
            if ((*piVar1 == 0) && (pMVar2->pCutBest[uVar5] == (Map_Cut_t *)0x0)) {
              local_34 = local_34 + pMVar2->p->pSuperLib->AreaInv;
            }
            iVar4 = pMVar2->nRefAct[2];
            pMVar2->nRefAct[2] = iVar4 + -1;
          }
          else {
            pMVar2->nRefAct[2] = pMVar2->nRefAct[2] + -1;
            iVar4 = pMVar2->nRefAct[uVar5];
            pMVar2->nRefAct[uVar5] = iVar4 + -1;
          }
          if (iVar4 < 2) {
            if (pMVar2->nRefAct[uVar5] < 0) {
              __assert_fail("pNodeChild->nRefAct[fPhaseChild] >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                            ,0x133,"float Map_CutRefDeref(Map_Cut_t *, int, int, int)");
            }
            goto LAB_003ff9bd;
          }
        }
        else {
          if ((pMVar2->pCutBest[0] == (Map_Cut_t *)0x0) || (pMVar2->pCutBest[1] == (Map_Cut_t *)0x0)
             ) {
            iVar4 = pMVar2->nRefAct[uVar5];
            pMVar2->nRefAct[uVar5] = iVar4 + 1;
            if ((iVar4 == 0) && (pMVar2->pCutBest[uVar5] == (Map_Cut_t *)0x0)) {
              local_34 = local_34 + pMVar2->p->pSuperLib->AreaInv;
            }
            iVar4 = pMVar2->nRefAct[2];
            pMVar2->nRefAct[2] = iVar4 + 1;
          }
          else {
            pMVar2->nRefAct[2] = pMVar2->nRefAct[2] + 1;
            iVar4 = pMVar2->nRefAct[uVar5];
            pMVar2->nRefAct[uVar5] = iVar4 + 1;
          }
          if (iVar4 < 1) {
LAB_003ff9bd:
            pCut_00 = pMVar2->pCutBest[uVar5];
            if (pCut_00 == (Map_Cut_t *)0x0) {
              uVar5 = (ulong)(iVar3 == 0);
              pCut_00 = pMVar2->pCutBest[uVar5];
            }
            fVar7 = Map_CutRefDeref(pCut_00,(int)uVar5,fReference,fUpdateProf);
            local_34 = local_34 + fVar7;
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pCut->nLeaves);
    }
  }
  return local_34;
}

Assistant:

float Map_CutRefDeref( Map_Cut_t * pCut, int fPhase, int fReference, int fUpdateProf )
{
    Map_Node_t * pNodeChild;
    Map_Cut_t * pCutChild;
    float aArea;
    int i, fPhaseChild;
//    int nRefs;

    // consider the elementary variable
    if ( pCut->nLeaves == 1 )
        return 0;
    // start the area of this cut
    aArea = Map_CutGetRootArea( pCut, fPhase );
    if ( fUpdateProf )
    {
        if ( fReference )
            Mio_GateIncProfile2( pCut->M[fPhase].pSuperBest->pRoot );
        else
            Mio_GateDecProfile2( pCut->M[fPhase].pSuperBest->pRoot );
    }
    // go through the children
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pNodeChild  = pCut->ppLeaves[i];
        fPhaseChild = Map_CutGetLeafPhase( pCut, fPhase, i );
        // get the reference counter of the child
/*
        // this code does not take inverters into account
        // the quality of area recovery seems to always be a little worse
        if ( fReference )
            nRefs = Map_NodeIncRefPhaseAct( pNodeChild, fPhaseChild );
        else
            nRefs = Map_NodeDecRefPhaseAct( pNodeChild, fPhaseChild );
        assert( nRefs >= 0 );
        // skip if the child was already reference before
        if ( nRefs > 0 )
            continue;
*/

        if ( fReference )
        {
            if ( pNodeChild->pCutBest[0] && pNodeChild->pCutBest[1] ) // both phases are present
            {
                // if this phase of the node is referenced, there is no recursive call
                pNodeChild->nRefAct[2]++;
                if ( pNodeChild->nRefAct[fPhaseChild]++ > 0 )
                    continue;
            }
            else // only one phase is present
            {
                // inverter should be added if the phase
                // (a) has no reference and (b) is implemented using other phase
                if ( pNodeChild->nRefAct[fPhaseChild]++ == 0 && pNodeChild->pCutBest[fPhaseChild] == NULL )
                    aArea += pNodeChild->p->pSuperLib->AreaInv;
                // if the node is referenced, there is no recursive call
                if ( pNodeChild->nRefAct[2]++ > 0 )
                    continue;
            }
        }
        else
        {
            if ( pNodeChild->pCutBest[0] && pNodeChild->pCutBest[1] ) // both phases are present
            {
                // if this phase of the node is referenced, there is no recursive call
                --pNodeChild->nRefAct[2];
                if ( --pNodeChild->nRefAct[fPhaseChild] > 0 )
                    continue;
            }
            else // only one phase is present
            {
                // inverter should be added if the phase
                // (a) has no reference and (b) is implemented using other phase
                if ( --pNodeChild->nRefAct[fPhaseChild] == 0 && pNodeChild->pCutBest[fPhaseChild] == NULL )
                    aArea += pNodeChild->p->pSuperLib->AreaInv;
                // if the node is referenced, there is no recursive call
                if ( --pNodeChild->nRefAct[2] > 0 )
                    continue;
            }
            assert( pNodeChild->nRefAct[fPhaseChild] >= 0 );
        }

        // get the child cut
        pCutChild = pNodeChild->pCutBest[fPhaseChild];
        // if the child does not have this phase mapped, take the opposite phase
        if ( pCutChild == NULL )
        {
            fPhaseChild = !fPhaseChild;
            pCutChild   = pNodeChild->pCutBest[fPhaseChild];
        }
        // reference and compute area recursively
        aArea += Map_CutRefDeref( pCutChild, fPhaseChild, fReference, fUpdateProf );
    }
    return aArea;
}